

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t ccsidr_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  ArchCPU_conflict2 *pAVar1;
  ulong local_30;
  uint32_t index;
  ARMCPU_conflict1 *cpu;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  pAVar1 = env_archcpu(env);
  if ((ri->secure & 1U) == 0) {
    local_30 = (env->cp15).field_1.field_0.csselr_ns;
  }
  else {
    local_30 = (env->cp15).field_1.field_0.csselr_s;
  }
  return pAVar1->ccsidr[local_30 & 0xffffffff];
}

Assistant:

static uint64_t ccsidr_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    ARMCPU *cpu = env_archcpu(env);

    /* Acquire the CSSELR index from the bank corresponding to the CCSIDR
     * bank
     */
    uint32_t index = A32_BANKED_REG_GET(env, csselr,
                                        ri->secure & ARM_CP_SECSTATE_S);

    return cpu->ccsidr[index];
}